

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cpp
# Opt level: O0

void __thiscall HttpData::HttpData(HttpData *this,EventLoop *loop,int connfd)

{
  element_type *this_00;
  element_type *connHandler;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  _Bind<void_(HttpData::*(HttpData_*))()> *__f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  Channel *in_stack_fffffffffffffe88;
  Channel *in_stack_fffffffffffffe90;
  EventLoop *in_stack_fffffffffffffe98;
  Channel *in_stack_fffffffffffffea0;
  
  std::enable_shared_from_this<HttpData>::enable_shared_from_this
            ((enable_shared_from_this<HttpData> *)0x10f9d0);
  *(undefined8 *)(in_RDI + 0x10) = in_RSI;
  operator_new(0xa8);
  Channel::Channel(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                   (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  std::shared_ptr<Channel>::shared_ptr<Channel,void>
            ((shared_ptr<Channel> *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  *(undefined4 *)(in_RDI + 0x28) = in_EDX;
  __f = (_Bind<void_(HttpData::*(HttpData_*))()> *)(in_RDI + 0x30);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffea0);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 0x50);
  std::__cxx11::string::string(this_01);
  *(undefined1 *)(in_RDI + 0x70) = 0;
  *(undefined4 *)(in_RDI + 0x74) = 0;
  *(undefined4 *)(in_RDI + 0x78) = 2;
  *(undefined4 *)(in_RDI + 0x7c) = 2;
  std::__cxx11::string::string(this_01);
  std::__cxx11::string::string(this_01);
  *(undefined4 *)(in_RDI + 0xc0) = 0;
  *(undefined4 *)(in_RDI + 0xc4) = 1;
  *(undefined4 *)(in_RDI + 200) = 0;
  *(undefined1 *)(in_RDI + 0xcc) = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10fad4);
  std::weak_ptr<TimerNode>::weak_ptr((weak_ptr<TimerNode> *)0x10faea);
  std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x10faf8);
  std::bind<void(HttpData::*)(),HttpData*>(&__f->_M_f,(HttpData **)in_stack_fffffffffffffe90);
  std::function<void()>::function<std::_Bind<void(HttpData::*(HttpData*))()>,void>
            ((function<void_()> *)this_01,__f);
  Channel::setReadHandler(in_stack_fffffffffffffe90,(CallBack *)in_stack_fffffffffffffe88);
  std::function<void_()>::~function((function<void_()> *)0x10fb7f);
  this_00 = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                      ((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                       0x10fb8d);
  std::bind<void(HttpData::*)(),HttpData*>(&__f->_M_f,(HttpData **)this_00);
  std::function<void()>::function<std::_Bind<void(HttpData::*(HttpData*))()>,void>
            ((function<void_()> *)this_01,__f);
  Channel::setWriteHandler(this_00,(CallBack *)in_stack_fffffffffffffe88);
  std::function<void_()>::~function((function<void_()> *)0x10fc14);
  connHandler = std::__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                           )0x10fc22);
  std::bind<void(HttpData::*)(),HttpData*>(&__f->_M_f,(HttpData **)this_00);
  std::function<void()>::function<std::_Bind<void(HttpData::*(HttpData*))()>,void>
            ((function<void_()> *)this_01,__f);
  Channel::setConnHandler(this_00,(CallBack *)connHandler);
  std::function<void_()>::~function((function<void_()> *)0x10fc92);
  return;
}

Assistant:

HttpData::HttpData(EventLoop* loop, int connfd)
        :loop_(loop),
        channel_(new Channel(loop,connfd)),
        fd_(connfd),
        error_(false),
        connectionState_(H_CONNECTED),
        method_(METHOD_GET),
        HTTPVersion_(HTTP_11),
        nowReadPos_(0),
        state_(STATE_PARSE_URI),
        hState_(H_START),
        keepAlive_(false) {
            channel_->setReadHandler(bind(&HttpData::handleRead, this));
            channel_->setWriteHandler(bind(&HttpData::handleWrite, this));
            channel_->setConnHandler(bind(&HttpData::handleConn, this));
}